

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

TextureCube * deqp::gles31::Functional::newOneLevelTextureCube(TextureFormat *format,int size)

{
  TextureCube *this;
  undefined4 local_30;
  int i;
  TextureCube *res;
  int size_local;
  TextureFormat *format_local;
  
  this = (TextureCube *)operator_new(0x168);
  tcu::TextureCube::TextureCube(this,format,size);
  for (local_30 = CUBEFACE_NEGATIVE_X; (int)local_30 < 6; local_30 = local_30 + CUBEFACE_POSITIVE_X)
  {
    tcu::TextureCube::allocLevel(this,local_30,0);
  }
  return this;
}

Assistant:

static inline tcu::TextureCube* newOneLevelTextureCube (const tcu::TextureFormat& format, int size)
{
	tcu::TextureCube* const res = new tcu::TextureCube(format, size);
	for (int i = 0; i < tcu::CUBEFACE_LAST; i++)
		res->allocLevel((tcu::CubeFace)i, 0);
	return res;
}